

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

App_p __thiscall CLI::App::get_subcommand_ptr(App *this,string *subcom)

{
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  App *this_00;
  bool bVar2;
  OptionNotFound *this_01;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  App_p AVar4;
  string local_70;
  string local_50;
  
  p_Var3 = (__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *)subcom[0x16]._M_dataplus._M_p;
  p_Var1 = (__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *)subcom[0x16]._M_string_length;
  while( true ) {
    if (p_Var3 == p_Var1) {
      this_01 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_70,in_RDX);
      OptionNotFound::OptionNotFound(this_01,&local_70);
      __cxa_throw(this_01,&OptionNotFound::typeinfo,Error::~Error);
    }
    this_00 = p_Var3->_M_ptr;
    ::std::__cxx11::string::string((string *)&local_50,in_RDX);
    bVar2 = check_name(this_00,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) break;
    p_Var3 = p_Var3 + 1;
  }
  std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var3);
  AVar4.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar4.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (App_p)AVar4.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE CLI::App_p App::get_subcommand_ptr(std::string subcom) const {
    for(const App_p &subcomptr : subcommands_)
        if(subcomptr->check_name(subcom))
            return subcomptr;
    throw OptionNotFound(subcom);
}